

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[29],char_const*,char[15],char[13],char_const*,char[40],unsigned_int,char[37],unsigned_int,char[13],unsigned_int,char[29],char_const*,char[52],unsigned_int,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [13],char **Args_4,char (*Args_5) [40],uint *Args_6,
          char (*Args_7) [37],uint *Args_8,char (*Args_9) [13],uint *Args_10,char (*Args_11) [29],
          char **Args_12,char (*Args_13) [52],uint *Args_14,char (*Args_15) [2])

{
  stringstream local_1e8 [8];
  stringstream ss;
  char **Args_local_4;
  char (*Args_local_3) [13];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [29];
  
  std::__cxx11::stringstream::stringstream(local_1e8);
  FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[15],char[13],char_const*,char[40],unsigned_int,char[37],unsigned_int,char[13],unsigned_int,char[29],char_const*,char[52],unsigned_int,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
             (char (*) [29])this,(char **)Args,(char (*) [15])Args_1,(char (*) [13])Args_2,
             (char **)Args_3,(char (*) [40])Args_4,(uint *)Args_5,(char (*) [37])Args_6,
             (uint *)Args_7,(char (*) [13])Args_8,(uint *)Args_9,(char (*) [29])Args_10,
             (char **)Args_11,(char (*) [52])Args_12,(uint *)Args_13,(char (*) [2])Args_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}